

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O3

iu_ostream * iutest::operator<<(iu_ostream *os,TestPartResult *result)

{
  ostream *poVar1;
  int in_ECX;
  string str;
  string local_38;
  
  detail::FormatFileLocation_abi_cxx11_
            (&local_38,(detail *)(result->super_iuCodeMessage).m_file,
             (char *)(ulong)(uint)(result->super_iuCodeMessage).m_line,in_ECX);
  std::__cxx11::string::append((char *)&local_38);
  std::__cxx11::string::append((char *)&local_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

inline iu_ostream& operator << (iu_ostream& os, const TestPartResult& result)
{
    return os << result.make_message();
}